

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::utf8_latin1_abi_cxx11_(string *__return_storage_ptr__,aux *this,string_view sv)

{
  pair<int,_int> pVar1;
  invalid_argument *this_00;
  char *pcVar2;
  char *extraout_RDX;
  int __val;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = (char *)sv._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_78._M_str = pcVar2;
  local_78._M_len = (size_t)this;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    if ((aux *)local_78._M_len == (aux *)0x0) {
      return __return_storage_ptr__;
    }
    str._M_str = pcVar2;
    str._M_len = (size_t)local_78._M_str;
    pVar1 = parse_utf8_codepoint((aux *)local_78._M_len,str);
    __val = pVar1.first;
    if ((__val == -1) || (0xff < __val)) break;
    local_78 = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_78,(long)pVar1 >> 0x20,0xffffffffffffffff);
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    pcVar2 = extraout_RDX;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::to_string(&local_68,__val);
  ::std::operator+(&local_48,"code point out of latin1 range: ",&local_68);
  ::std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
  __cxa_throw(this_00,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument)
  ;
}

Assistant:

std::string utf8_latin1(std::string_view sv)
	{
		std::string out;
		while (!sv.empty())
		{
			auto const [cp, len] = parse_utf8_codepoint(sv);

			if (cp == -1 || cp > 0xff)
				throw std::invalid_argument("code point out of latin1 range: " + std::to_string(cp));

			sv = sv.substr(std::size_t(len));

			out.push_back(char(static_cast<unsigned char>(cp)));
		}
		return out;
	}